

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O1

void __thiscall Annotations::GenerateList(Annotations *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Annotations *pAVar5;
  size_type sVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  sqlite3_stmt *stmt;
  Annotations *local_138;
  Annotation ann;
  char sql [77];
  
  pcVar8 = "SELECT id,side,posx,posy,net,part,pin,note from annotations where visible=1;";
  pcVar10 = sql;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined8 *)pcVar10 = *(undefined8 *)pcVar8;
    pcVar8 = pcVar8 + 8;
    pcVar10 = pcVar10 + 8;
  }
  builtin_strncpy(sql + 0x48,"e=1;",5);
  iVar7 = sqlite3_prepare_v2(this->sqldb,sql,0xffffffff,&stmt,0);
  if (iVar7 == 0) {
    local_138 = this;
    std::vector<Annotation,_std::allocator<Annotation>_>::_M_erase_at_end
              (&this->annotations,
               (this->annotations).super__Vector_base<Annotation,_std::allocator<Annotation>_>.
               _M_impl.super__Vector_impl_data._M_start);
    paVar1 = &ann.note.field_2;
    paVar2 = &ann.net.field_2;
    paVar3 = &ann.part.field_2;
    paVar4 = &ann.pin.field_2;
    while( true ) {
      iVar7 = sqlite3_step(stmt);
      pAVar5 = local_138;
      if (iVar7 != 100) break;
      ann.note._M_string_length = 0;
      ann.note.field_2._M_local_buf[0] = '\0';
      ann.net._M_string_length = 0;
      ann.net.field_2._M_local_buf[0] = '\0';
      ann.part._M_string_length = 0;
      ann.part.field_2._M_local_buf[0] = '\0';
      ann.pin._M_string_length = 0;
      ann.pin.field_2._M_local_buf[0] = '\0';
      ann.note._M_dataplus._M_p = (pointer)paVar1;
      ann.net._M_dataplus._M_p = (pointer)paVar2;
      ann.part._M_dataplus._M_p = (pointer)paVar3;
      ann.pin._M_dataplus._M_p = (pointer)paVar4;
      ann.id = sqlite3_column_int(stmt,0);
      ann.side = sqlite3_column_int(stmt,1);
      iVar7 = sqlite3_column_int(stmt,2);
      ann.x = (double)iVar7;
      iVar7 = sqlite3_column_int(stmt,3);
      ann.y = (double)iVar7;
      ann.hovered = false;
      pcVar10 = (char *)sqlite3_column_text(stmt);
      sVar6 = ann.net._M_string_length;
      pcVar8 = "";
      if (pcVar10 != (char *)0x0) {
        pcVar8 = pcVar10;
      }
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&ann.net,0,(char *)sVar6,(ulong)pcVar8);
      pcVar10 = (char *)sqlite3_column_text(stmt);
      sVar6 = ann.part._M_string_length;
      pcVar8 = "";
      if (pcVar10 != (char *)0x0) {
        pcVar8 = pcVar10;
      }
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&ann.part,0,(char *)sVar6,(ulong)pcVar8);
      pcVar10 = (char *)sqlite3_column_text(stmt);
      sVar6 = ann.pin._M_string_length;
      pcVar8 = "";
      if (pcVar10 != (char *)0x0) {
        pcVar8 = pcVar10;
      }
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&ann.pin,0,(char *)sVar6,(ulong)pcVar8);
      pcVar10 = (char *)sqlite3_column_text(stmt);
      sVar6 = ann.note._M_string_length;
      pcVar8 = "";
      if (pcVar10 != (char *)0x0) {
        pcVar8 = pcVar10;
      }
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&ann.note,0,(char *)sVar6,(ulong)pcVar8);
      if (local_138->debug == true) {
        fprintf(_stderr,"%d(%d:%f,%f) Net:%s Part:%s Pin:%s: Note:%s\nAdded\n",ann.x,ann.y,
                (ulong)(uint)ann.id,(ulong)(uint)ann.side,ann.net._M_dataplus._M_p,
                ann.part._M_dataplus._M_p,ann.pin._M_dataplus._M_p,ann.note._M_dataplus._M_p);
      }
      std::vector<Annotation,_std::allocator<Annotation>_>::push_back(&this->annotations,&ann);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ann.pin._M_dataplus._M_p != paVar4) {
        operator_delete(ann.pin._M_dataplus._M_p,
                        CONCAT71(ann.pin.field_2._M_allocated_capacity._1_7_,
                                 ann.pin.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ann.part._M_dataplus._M_p != paVar3) {
        operator_delete(ann.part._M_dataplus._M_p,
                        CONCAT71(ann.part.field_2._M_allocated_capacity._1_7_,
                                 ann.part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ann.net._M_dataplus._M_p != paVar2) {
        operator_delete(ann.net._M_dataplus._M_p,
                        CONCAT71(ann.net.field_2._M_allocated_capacity._1_7_,
                                 ann.net.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ann.note._M_dataplus._M_p != paVar1) {
        operator_delete(ann.note._M_dataplus._M_p,
                        CONCAT71(ann.note.field_2._M_allocated_capacity._1_7_,
                                 ann.note.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((iVar7 != 0x65) && (local_138->debug == true)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"SELECT failed: ",0xf);
      pcVar8 = (char *)sqlite3_errmsg(pAVar5->sqldb);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x23d810);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    sqlite3_finalize(stmt);
  }
  else if (this->debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SELECT failed: ",0xf);
    pcVar8 = (char *)sqlite3_errmsg(this->sqldb);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x23d810);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  return;
}

Assistant:

void Annotations::GenerateList(void) {
	sqlite3_stmt *stmt;
	char sql[] = "SELECT id,side,posx,posy,net,part,pin,note from annotations where visible=1;";
	int rc;

	rc = sqlite3_prepare_v2(sqldb, sql, -1, &stmt, NULL);
	if (rc != SQLITE_OK) {
		if (debug) std::cerr << "SELECT failed: " << sqlite3_errmsg(sqldb) << std::endl;
		return; // or throw
	}

	annotations.clear();
	while ((rc = sqlite3_step(stmt)) == SQLITE_ROW) {
		Annotation ann;
		ann.id      = sqlite3_column_int(stmt, 0);
		ann.side    = sqlite3_column_int(stmt, 1);
		ann.x       = sqlite3_column_int(stmt, 2);
		ann.y       = sqlite3_column_int(stmt, 3);
		ann.hovered = false;

		const char *p = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 4));
		if (!p) p     = "";
		ann.net       = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 5));
		if (!p) p = "";
		ann.part  = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 6));
		if (!p) p = "";
		ann.pin   = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 7));
		if (!p) p = "";
		ann.note  = p;

		if (debug)
			fprintf(stderr,
			        "%d(%d:%f,%f) Net:%s Part:%s Pin:%s: Note:%s\nAdded\n",
			        ann.id,
			        ann.side,
			        ann.x,
			        ann.y,
			        ann.net.c_str(),
			        ann.part.c_str(),
			        ann.pin.c_str(),
			        ann.note.c_str());

		annotations.push_back(ann);
	}
	if (rc != SQLITE_DONE) {
		if (debug) std::cerr << "SELECT failed: " << sqlite3_errmsg(sqldb) << std::endl;
		// if you return/throw here, don't forget the finalize
	}
	sqlite3_finalize(stmt);
}